

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

int __thiscall Parse::varDeclarationList(Parse *this)

{
  int *piVar1;
  DelimiterTable *pDVar2;
  pointer pTVar3;
  _Alloc_hider _Var4;
  SymbolTable *pSVar5;
  pointer pvVar6;
  pointer pcVar7;
  int iVar8;
  Type TVar9;
  uint uVar10;
  mapped_type *pmVar11;
  long lVar12;
  ostream *poVar13;
  char *pcVar14;
  Parse *pPVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  string curName;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  ulong local_1a8;
  _Bit_pointer puStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  key_type local_150;
  string local_130;
  key_type local_110;
  string local_f0;
  key_type local_d0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar2 = this->delimiterTable;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,",","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&(pDVar2->
                            super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).index,&local_d0);
    bVar17 = *pmVar11 ==
             (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar17 = false;
  }
  if (bVar17) {
    lVar12 = (long)this->curIndex + 1;
    this->curIndex = (int)lVar12;
    if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar12].type == IDENTIFIER) {
      pTVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      _Var4._M_p = pTVar3[lVar12].name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,_Var4._M_p,_Var4._M_p + pTVar3[lVar12].name._M_string_length);
      pSVar5 = this->st;
      pTVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var4._M_p = pTVar3[this->curIndex].name._M_dataplus._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,_Var4._M_p,
                 _Var4._M_p + pTVar3[this->curIndex].name._M_string_length);
      iVar8 = SymbolTable::searchSymbolName(pSVar5,&local_f0,this->curFun);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (iVar8 < 0) {
        this->curSymInd = this->curSymInd + 1;
        local_1b8._8_8_ = 0;
        uStack_190._0_4_ = 0;
        uStack_190._4_4_ = 0;
        local_188 = 0.0;
        local_1a8 = 0;
        puStack_1a0 = (_Bit_pointer)0x0;
        local_1c8._8_8_ = (_Bit_type *)0x0;
        local_1b8._M_allocated_capacity = 0;
        local_198._0_4_ = 0;
        local_198._4_4_ = 0;
        uStack_180._0_1_ = false;
        uStack_180._1_1_ = true;
        uStack_180._2_6_ = 0;
        local_1c8._0_8_ = &local_1b8;
        std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
        emplace_back<SymbolTableElement>
                  ((this->st->symbolTable).
                   super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->curFun,
                   (SymbolTableElement *)local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._0_8_ != &local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
        }
        pvVar6 = (this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = *(long *)&pvVar6[this->curFun].
                           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                           ._M_impl.super__Vector_impl_data;
        lVar16 = (long)((int)((ulong)((long)*(pointer *)
                                             ((long)&pvVar6[this->curFun].
                                                                                                          
                                                  super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar12) >>
                             4) * -0x33333333 + -1) * 0x50;
        std::__cxx11::string::_M_assign((string *)(lVar12 + lVar16));
        *(undefined4 *)
         (*(long *)&(this->st->symbolTable).
                    super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 0x24 + lVar16) = 3;
        lVar12 = (long)this->curIndex + 1;
        this->curIndex = (int)lVar12;
        if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar12].type == DELIMTER) {
          pDVar2 = this->delimiterTable;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"[","");
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&(pDVar2->
                                  super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).index,&local_110);
          bVar17 = *pmVar11 ==
                   (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                   super__Vector_impl_data._M_start[this->curIndex].id;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar17 = false;
        }
        iVar8 = 0;
        if (!bVar17) {
LAB_0010b07e:
          if (bVar17) {
            std::vector<QuadTuple,std::allocator<QuadTuple>>::
            emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[4],char_const(&)[3]>
                      ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                       (char (*) [7])"vardef",&local_170,(char (*) [4])"arr",(char (*) [3])"__");
            local_1a8 = 0;
            puStack_1a0 = (_Bit_pointer)0x0;
            local_1b8._M_allocated_capacity = 0;
            local_1b8._8_8_ = 0;
            local_1c8._0_8_ = (pointer)0x0;
            local_1c8._8_8_ = (_Bit_type *)0x0;
            local_198._0_4_ = 0;
            local_198._4_4_ = 0;
            pcVar7 = (this->curType)._M_dataplus._M_p;
            pPVar15 = (Parse *)local_50;
            local_50._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)(local_50 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pPVar15,pcVar7,pcVar7 + (this->curType)._M_string_length);
            TVar9 = toType(pPVar15,(string *)local_50);
            local_198._0_4_ = TVar9;
            if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_50._0_8_ !=
                (vector<QuadTuple,_std::allocator<QuadTuple>_> *)(local_50 + 0x10)) {
              operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
            }
            local_1c8._4_4_ = iVar8 + -1;
            pcVar7 = (this->curType)._M_dataplus._M_p;
            pPVar15 = (Parse *)local_70;
            local_70._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pPVar15,pcVar7,pcVar7 + (this->curType)._M_string_length);
            uVar10 = typeSize(pPVar15,(string *)local_70);
            local_198._4_4_ = uVar10;
            if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_70._0_8_ !=
                (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_60) {
              operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
            }
            if ((uint)local_1c8._0_4_ <= (uint)local_1c8._4_4_) {
              uVar10 = local_1c8._0_4_;
              do {
                std::vector<bool,_std::allocator<bool>_>::push_back
                          ((vector<bool,_std::allocator<bool>_> *)(local_1c8 + 8),true);
                uVar10 = uVar10 + 1;
              } while (uVar10 <= (uint)local_1c8._4_4_);
            }
            std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::push_back
                      (&this->st->arrayTableVec,(value_type *)local_1c8);
            pSVar5 = this->st;
            lVar12 = *(long *)&(pSVar5->symbolTable).
                               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                               super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                               ._M_impl.super__Vector_impl_data;
            *(undefined4 *)(lVar12 + 0x20 + lVar16) = 5;
            *(int *)(lVar12 + 0x30 + lVar16) =
                 (int)((ulong)((long)(pSVar5->arrayTableVec).
                                     super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(pSVar5->arrayTableVec).
                                    super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 +
                 -1;
            *(uint *)(lVar12 + 0x2c + lVar16) = iVar8 * local_198._4_4_;
            if ((_Bit_type *)local_1c8._8_8_ != (_Bit_type *)0x0) {
              operator_delete((void *)local_1c8._8_8_,(long)puStack_1a0 - local_1c8._8_8_);
              local_1c8._8_8_ = (_Bit_type *)0x0;
              local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffff00000000
              ;
              local_1b8._8_8_ = 0;
              local_1a8 = local_1a8 & 0xffffffff00000000;
              puStack_1a0 = (_Bit_pointer)0x0;
            }
          }
          else {
            std::vector<QuadTuple,std::allocator<QuadTuple>>::
            emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                      ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                       (char (*) [7])"vardef",&local_170,&this->curType,(char (*) [3])"--");
            pcVar7 = (this->curType)._M_dataplus._M_p;
            pPVar15 = (Parse *)local_90;
            local_90._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pPVar15,pcVar7,pcVar7 + (this->curType)._M_string_length);
            TVar9 = toType(pPVar15,(string *)local_90);
            *(Type *)(*(long *)&(this->st->symbolTable).
                                super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                                super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                ._M_impl.super__Vector_impl_data + 0x20 + lVar16) = TVar9;
            if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_90._0_8_ !=
                (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_80) {
              operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
            }
            *(int *)(*(long *)&(this->st->symbolTable).
                               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                               super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                               ._M_impl.super__Vector_impl_data + 0x34 + lVar16) =
                 (this->st->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[this->curFun];
            pcVar7 = (this->curType)._M_dataplus._M_p;
            pPVar15 = (Parse *)local_b0;
            local_b0._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)pPVar15,pcVar7,pcVar7 + (this->curType)._M_string_length);
            uVar10 = typeSize(pPVar15,(string *)local_b0);
            piVar1 = (this->st->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + this->curFun;
            *piVar1 = *piVar1 + uVar10;
            if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_b0._0_8_ !=
                (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_a0) {
              operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._0_8_ + 1));
            }
          }
          varDeclarationList(this);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          return 1;
        }
        lVar12 = (long)this->curIndex + 1;
        this->curIndex = (int)lVar12;
        pTVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pTVar3[lVar12].type == INTCONST) {
          pcVar7 = pTVar3[lVar12].name._M_dataplus._M_p;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar7,pcVar7 + pTVar3[lVar12].name._M_string_length);
          iVar8 = string2num<int>(&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          lVar12 = (long)this->curIndex + 1;
          this->curIndex = (int)lVar12;
          if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar12].type == DELIMTER) {
            pDVar2 = this->delimiterTable;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"]","");
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&(pDVar2->
                                    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).index,&local_150);
            bVar18 = *pmVar11 ==
                     (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                     super__Vector_impl_data._M_start[this->curIndex].id;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar18 = false;
          }
          if (bVar18) {
            this->curIndex = this->curIndex + 1;
            goto LAB_0010b07e;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_33db5,0x21);
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_33d22,3);
          std::endl<char,std::char_traits<char>>(poVar13);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_33d91,0x27);
          poVar13 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_33d22,3);
          std::endl<char,std::char_traits<char>>(poVar13);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_ac1f6 + 3,6);
        pTVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pTVar3[this->curIndex].name._M_dataplus._M_p,
                             pTVar3[this->curIndex].name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_33d54,9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_34094 + 0x16,6);
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            (poVar13,(this->tokenVec->
                                     super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                     super__Vector_impl_data._M_start[this->curIndex].line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,anon_var_dwarf_33d22,3);
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      goto LAB_0010b3da;
    }
    pcVar14 = anon_var_dwarf_33cf9;
  }
  else {
    if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
        super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
      pDVar2 = this->delimiterTable;
      local_1c8._0_8_ = &local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,anon_var_dwarf_33e1e + 0x12,anon_var_dwarf_33e1e + 0x13);
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&(pDVar2->
                              super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).index,(key_type *)local_1c8);
      bVar17 = *pmVar11 ==
               (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start[this->curIndex].id;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
    }
    else {
      bVar17 = false;
    }
    if (bVar17) {
      this->curIndex = this->curIndex + 1;
      return 1;
    }
    pcVar14 = anon_var_dwarf_33e1e;
  }
  poVar13 = std::operator<<((ostream *)&std::cout,pcVar14);
  poVar13 = (ostream *)
            std::ostream::operator<<
                      (poVar13,(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
  poVar13 = std::operator<<(poVar13,anon_var_dwarf_33d22);
  std::endl<char,std::char_traits<char>>(poVar13);
LAB_0010b3da:
  exit(0);
}

Assistant:

int Parse::varDeclarationList() {
    int index = curIndex;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
            if(tokenVec[curIndex].type != TokenType::IDENTIFIER) {
                cout << "类型声明后必须跟着标识符在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            string curName = tokenVec[curIndex].name;
            int stIndex = 0;
            stIndex = st.searchSymbolName(tokenVec[curIndex].name, curFun);
            if(stIndex >= 0) {
//            cout << tokenVec[curIndex].name << endl;
                cout << "变量"<<  tokenVec[curIndex].name <<"重定义" << "在第" << tokenVec[curIndex].line  << "行" << endl;
                exit(0);
            }

            curSymInd++;
            st.symbolTable[curFun].emplace_back(SymbolTableElement());
            int symind = static_cast<int>(st.symbolTable[curFun].size() - 1);
            st.symbolTable[curFun][symind].name = curName;
            st.symbolTable[curFun][symind].cat = Category::VARIABLE;


            bool arrayFlag = false;
            curIndex++;
            int arrLen = 0;

            if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["["] == tokenVec[curIndex].id) {
                curIndex++;
                if(tokenVec[curIndex].type ==  INTCONST) {
                    arrLen = string2num<int >(tokenVec[curIndex].name);
                    curIndex++;
                } else {
                    cout << "数组长度必须是整型变量在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["]"] == tokenVec[curIndex].id) {
                    curIndex++;
                } else {
                    cout << "数组声明缺少右括号在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                arrayFlag = true;
            }
            if(arrayFlag) {
                quadVec.emplace_back("vardef", curName, "arr", "__");
                ArrayInfo arrayInfoEle{};
                arrayInfoEle.low = 0;
                arrayInfoEle.type = toType(curType);
                arrayInfoEle.up = static_cast<unsigned int>(arrLen - 1);
                arrayInfoEle.clen = typeSize(curType);
                for(int ind = arrayInfoEle.low ; ind <= arrayInfoEle.up; ind++) {
                    arrayInfoEle.activeMess.push_back(true);
                }
                st.arrayTableVec.push_back(arrayInfoEle);
                st.symbolTable[curFun][symind].type = ARRAY;
                st.symbolTable[curFun][symind].aiInd = static_cast<int>(st.arrayTableVec.size() - 1);
                st.symbolTable[curFun][symind].len = arrayInfoEle.clen * arrLen;
            }else {
                quadVec.emplace_back("vardef", curName, curType, "--");
                st.symbolTable[curFun][symind].type = toType(curType);
                st.symbolTable[curFun][symind].vall = st.vallVec[curFun];
                st.vallVec[curFun] += typeSize(curType);
            }
            varDeclarationList();
    } else if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
        curIndex++;
        return 1;
    } else {
        cout << "变量声明缺少;" << tokenVec[curIndex].line  << "行" << endl;
        exit(0);
    }
    return 1;
}